

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O2

void Eigen::internal::queryCacheSizes_intel(int *l1,int *l2,int *l3,int max_std_funcs)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  int *piVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  byte abStack_18 [4];
  undefined4 uStack_14;
  
  if (3 < max_std_funcs) {
    *l3 = 0;
    *l2 = 0;
    *l1 = 0;
    uVar7 = 0;
    do {
      puVar1 = (uint *)cpuid_Deterministic_Cache_Parameters_info(4);
      uVar2 = *puVar1;
      uVar3 = puVar1[1];
      if (((uVar2 & 0xd) == 1) &&
         (((uVar6 = uVar2 >> 5 & 7, piVar5 = l1, uVar6 == 1 || (piVar5 = l3, uVar6 == 3)) ||
          (piVar5 = l2, uVar6 == 2)))) {
        *piVar5 = (puVar1[3] + 1) * ((uVar3 >> 0x16) + 1) *
                  ((uVar3 & 0xfff) + 1) * ((uVar3 >> 0xc & 0x3ff) + 1);
      }
    } while (((uVar2 & 0xf) != 0) && (bVar8 = uVar7 < 0xf, uVar7 = uVar7 + 1, bVar8));
    return;
  }
  if (max_std_funcs < 2) {
    *l3 = 0;
    *l2 = 0;
    *l1 = 0;
    return;
  }
  *l3 = 0;
  *l2 = 0;
  *l1 = 0;
  lVar4 = cpuid_cache_tlb_info(2);
  bVar8 = false;
  uStack_14 = *(undefined4 *)(lVar4 + 4);
  lVar4 = 2;
  do {
    if (lVar4 == 0x10) {
      if ((bVar8) && (*l2 == *l3)) {
        *l3 = 0;
      }
      *l1 = *l1 << 10;
      *l2 = *l2 << 10;
      *l3 = *l3 << 10;
      return;
    }
    switch(abStack_18[lVar4]) {
    case 10:
    case 0x66:
      *l1 = 8;
      break;
    case 0xc:
    case 0x10:
    case 0x15:
    case 0x60:
    case 0x67:
      *l1 = 0x10;
      break;
    case 0xe:
      *l1 = 0x18;
      break;
    case 0x1a:
      *l2 = 0x60;
      break;
    case 0x22:
      *l3 = 0x200;
      break;
    case 0x23:
      *l3 = 0x400;
      break;
    case 0x25:
    case 0x88:
      *l3 = 0x800;
      break;
    case 0x29:
    case 0x46:
    case 0x89:
switchD_0014d5d3_caseD_29:
      *l3 = 0x1000;
      break;
    case 0x2c:
    case 0x30:
    case 0x68:
      *l1 = 0x20;
      break;
    case 0x39:
    case 0x3b:
    case 0x41:
    case 0x79:
    case 0x81:
      *l2 = 0x80;
      break;
    case 0x3a:
      *l2 = 0xc0;
      break;
    case 0x3c:
    case 0x42:
    case 0x7a:
    case 0x7e:
    case 0x82:
      *l2 = 0x100;
      break;
    case 0x3d:
      *l2 = 0x180;
      break;
    case 0x3e:
    case 0x43:
    case 0x7b:
    case 0x7f:
    case 0x80:
    case 0x83:
    case 0x86:
      *l2 = 0x200;
      break;
    case 0x40:
      *l2 = 0;
      break;
    case 0x44:
    case 0x78:
    case 0x7c:
    case 0x84:
    case 0x87:
      *l2 = 0x400;
      break;
    case 0x45:
    case 0x7d:
    case 0x85:
      *l2 = 0x800;
      break;
    case 0x47:
    case 0x4b:
    case 0x8a:
      *l3 = 0x2000;
      break;
    case 0x48:
      *l2 = 0xc00;
      break;
    case 0x49:
      if (*l2 != 0) goto switchD_0014d5d3_caseD_29;
      *l2 = 0x1000;
      *l3 = 0x1000;
      bVar8 = true;
      break;
    case 0x4a:
      *l3 = 0x1800;
      break;
    case 0x4c:
      *l3 = 0x3000;
      break;
    case 0x4d:
      *l3 = 0x4000;
      break;
    case 0x4e:
      *l2 = 0x1800;
      break;
    case 0x8d:
      *l3 = 0xc00;
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

inline void queryCacheSizes_intel(int& l1, int& l2, int& l3, int max_std_funcs)
{
  if(max_std_funcs>=4)
    queryCacheSizes_intel_direct(l1,l2,l3);
  else if(max_std_funcs>=2)
    queryCacheSizes_intel_codes(l1,l2,l3);
  else
    l1 = l2 = l3 = 0;
}